

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBmc.c
# Opt level: O0

void Abc_NtkBmc(Abc_Ntk_t *pNtk,int nFrames,int fInit,int fVerbose)

{
  int nLatches;
  uint uVar1;
  Ivy_Man_t *pMan_00;
  Vec_Ptr_t *local_88;
  Vec_Ptr_t *vMapping;
  Ivy_Man_t *pFraig;
  Ivy_Man_t *pFrames;
  Ivy_Man_t *pMan;
  Ivy_FraigParams_t *pParams;
  Ivy_FraigParams_t Params;
  int fVerbose_local;
  int fInit_local;
  int nFrames_local;
  Abc_Ntk_t *pNtk_local;
  
  pMan = (Ivy_Man_t *)&pParams;
  Params._60_4_ = fVerbose;
  pMan_00 = Abc_NtkIvyBefore(pNtk,0,0);
  pFrames = pMan_00;
  nLatches = Abc_NtkLatchNum(pNtk);
  pFraig = Ivy_ManFrames(pMan_00,nLatches,nFrames,fInit,&local_88);
  Ivy_FraigParamsDefault((Ivy_FraigParams_t *)pMan);
  (pMan->Ghost).nRefs = 1000000000;
  (pMan->Ghost).TravId = 0;
  (pMan->Ghost).Id = 0;
  vMapping = (Vec_Ptr_t *)Ivy_FraigPerform(pFraig,(Ivy_FraigParams_t *)pMan);
  uVar1 = Ivy_ManNodeNum(pFraig);
  printf("Frames have %6d nodes.  ",(ulong)uVar1);
  uVar1 = Ivy_ManNodeNum((Ivy_Man_t *)vMapping);
  printf("Fraig has %6d nodes.\n",(ulong)uVar1);
  Vec_PtrFree(local_88);
  Ivy_ManStop((Ivy_Man_t *)vMapping);
  Ivy_ManStop(pFraig);
  Ivy_ManStop(pFrames);
  return;
}

Assistant:

void Abc_NtkBmc( Abc_Ntk_t * pNtk, int nFrames, int fInit, int fVerbose )
{
    Ivy_FraigParams_t Params, * pParams = &Params; 
    Ivy_Man_t * pMan, * pFrames, * pFraig;
    Vec_Ptr_t * vMapping;
    // convert to IVY manager
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );
    // generate timeframes
    pFrames = Ivy_ManFrames( pMan, Abc_NtkLatchNum(pNtk), nFrames, fInit, &vMapping );
    // fraig the timeframes
    Ivy_FraigParamsDefault( pParams );
    pParams->nBTLimitNode = ABC_INFINITY;
    pParams->fVerbose = 0;
    pParams->fProve = 0;
    pFraig = Ivy_FraigPerform( pFrames, pParams );
printf( "Frames have %6d nodes.  ", Ivy_ManNodeNum(pFrames) );
printf( "Fraig has %6d nodes.\n", Ivy_ManNodeNum(pFraig) );
    // report the classes
//    if ( fVerbose )
//        Abc_NtkBmcReport( pMan, pFrames, pFraig, vMapping, nFrames );
    // free stuff
    Vec_PtrFree( vMapping );
    Ivy_ManStop( pFraig );
    Ivy_ManStop( pFrames );
    Ivy_ManStop( pMan );
}